

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_tree.c
# Opt level: O3

int handle_start_array(void *ctx)

{
  int iVar1;
  yajl_val v;
  uint uVar2;
  
  v = (yajl_val)calloc(1,0x28);
  if (v == (yajl_val)0x0) {
    if (*(char **)((long)ctx + 0x10) == (char *)0x0) {
      uVar2 = 0;
    }
    else {
      uVar2 = 0;
      snprintf(*(char **)((long)ctx + 0x10),*(size_t *)((long)ctx + 0x18),"Out of memory");
    }
  }
  else {
    v->type = yajl_t_array;
    iVar1 = context_push((context_t *)ctx,v);
    uVar2 = (uint)(iVar1 == 0);
  }
  return uVar2;
}

Assistant:

static int handle_start_array (void *ctx)
{
    yajl_val v;

    v = value_alloc(yajl_t_array);
    if (v == NULL)
        RETURN_ERROR ((context_t *) ctx, STATUS_ABORT, "Out of memory");

    v->u.array.values = NULL;
    v->u.array.len = 0;

    return ((context_push (ctx, v) == 0) ? STATUS_CONTINUE : STATUS_ABORT);
}